

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentBG.cpp
# Opt level: O2

Index __thiscall AgentBG::GetMaximizingActionIndex(AgentBG *this,JointBeliefInterface *jb)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  Index a;
  ulong uVar4;
  double dVar5;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  BGPolicyIndex bI;
  undefined1 local_38 [8];
  
  auVar7 = ZEXT816(0xffefffffffffffff);
  uVar3 = 0x7fffffff;
  uVar4 = 0;
  while( true ) {
    auVar8._0_8_ = auVar7._0_8_;
    uVar2 = (**(code **)((long)*(((this->super_AgentDelayedSharedObservations).
                                  super_AgentDecPOMDPDiscrete._m_pu)->super_PlanningUnitMADPDiscrete
                                )._m_madp + 0x68))();
    if (uVar2 == uVar4) break;
    if (this->_m_QBGstationary == (QAV<PerseusBGPlanner> *)0x0) {
      dVar5 = (double)(**(code **)(*(long *)(*(long *)(this->_m_QBGnonStationary + 8) + 0x18) + 0x58
                                  ))(*(long *)(this->_m_QBGnonStationary + 8) + 0x18,jb,
                                     (int)this->_m_t,uVar4,local_38);
      uVar6 = extraout_XMM0_Qb_00;
    }
    else {
      lVar1 = *(long *)(this->_m_QBGstationary + 8);
      dVar5 = (double)(**(code **)(*(long *)(lVar1 + 0x18) + 0x48))(lVar1 + 0x18,jb,uVar4,local_38);
      uVar6 = extraout_XMM0_Qb;
    }
    auVar8._8_8_ = 0;
    auVar7._8_8_ = uVar6;
    auVar7._0_8_ = dVar5;
    auVar7 = vmaxsd_avx(auVar7,auVar8);
    if (auVar8._0_8_ < dVar5) {
      uVar3 = uVar4;
    }
    uVar4 = (ulong)((int)uVar4 + 1);
  }
  return (Index)uVar3;
}

Assistant:

Index AgentBG::GetMaximizingActionIndex(const JointBeliefInterface &jb) const
{
    double v=-DBL_MAX,q;
    Index ja=INT_MAX;
    AlphaVector::BGPolicyIndex bI;

    for(Index a=0;a!=GetPU()->GetNrJointActions();++a)
    {
        if(_m_QBGstationary)
            q=_m_QBGstationary->GetQ(jb,a,bI);
        else
            q=_m_QBGnonStationary->GetQ(jb,_m_t,a,bI);
        
        if(q>v)
        {
            v=q;
            ja=a;
        }
    }

    return(ja);
}